

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a4df88::HandleDirectoryMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  bool bVar2;
  size_type sVar3;
  reference in_path;
  cmMakefile *pcVar4;
  string *in_base;
  cmGlobalGenerator *this;
  allocator<char> local_c1;
  string local_c0;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_98 [8];
  string dir;
  cmMakefile *mf;
  allocator<char> local_59;
  string local_58;
  byte local_33;
  byte local_32;
  byte local_31;
  bool remove_local;
  bool appendMode_local;
  string *psStack_30;
  bool appendAsString_local;
  string *propertyValue_local;
  string *propertyName_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmExecutionStatus *status_local;
  
  local_33 = remove;
  local_32 = appendMode;
  local_31 = appendAsString;
  psStack_30 = propertyValue;
  propertyValue_local = propertyName;
  propertyName_local = (string *)names;
  names_local = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)status;
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(names);
  psVar1 = names_local;
  if (sVar3 < 2) {
    dir.field_2._8_8_ = cmExecutionStatus::GetMakefile((cmExecutionStatus *)names_local);
    bVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)propertyName_local);
    if (!bVar2) {
      local_a0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)propertyName_local);
      in_path = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_a0);
      pcVar4 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)names_local);
      in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar4);
      cmsys::SystemTools::CollapseFullPath((string *)local_98,in_path,in_base);
      pcVar4 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)names_local);
      this = cmMakefile::GetGlobalGenerator(pcVar4);
      dir.field_2._8_8_ = cmGlobalGenerator::FindMakefile(this,(string *)local_98);
      psVar1 = names_local;
      bVar2 = (cmMakefile *)dir.field_2._8_8_ == (cmMakefile *)0x0;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,&local_c1);
        cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        status_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_98);
      if (bVar2) goto LAB_0058c94d;
    }
    if ((local_32 & 1) == 0) {
      if ((local_33 & 1) == 0) {
        cmMakefile::SetProperty((cmMakefile *)dir.field_2._8_8_,propertyValue_local,psStack_30);
      }
      else {
        cmMakefile::SetProperty((cmMakefile *)dir.field_2._8_8_,propertyValue_local,(char *)0x0);
      }
    }
    else {
      cmMakefile::AppendProperty
                ((cmMakefile *)dir.field_2._8_8_,propertyValue_local,psStack_30,(bool)(local_31 & 1)
                );
    }
    status_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"allows at most one name for DIRECTORY scope.",&local_59);
    cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    status_local._7_1_ = 0;
  }
LAB_0058c94d:
  return (bool)(status_local._7_1_ & 1);
}

Assistant:

bool HandleDirectoryMode(cmExecutionStatus& status,
                         const std::set<std::string>& names,
                         const std::string& propertyName,
                         const std::string& propertyValue, bool appendAsString,
                         bool appendMode, bool remove)
{
  if (names.size() > 1) {
    status.SetError("allows at most one name for DIRECTORY scope.");
    return false;
  }

  // Default to the current directory.
  cmMakefile* mf = &status.GetMakefile();

  // Lookup the directory if given.
  if (!names.empty()) {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = cmSystemTools::CollapseFullPath(
      *names.begin(), status.GetMakefile().GetCurrentSourceDirectory());

    mf = status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
    if (!mf) {
      // Could not find the directory.
      status.SetError(
        "DIRECTORY scope provided but requested directory was not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
  }

  // Set or append the property.
  if (appendMode) {
    mf->AppendProperty(propertyName, propertyValue, appendAsString);
  } else {
    if (remove) {
      mf->SetProperty(propertyName, nullptr);
    } else {
      mf->SetProperty(propertyName, propertyValue);
    }
  }

  return true;
}